

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O3

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::resizeImageBilinear<unsigned_char>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *__return_storage_ptr__,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long w,long h)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  vector<int,_std::allocator<int>_> v;
  allocator_type local_5d;
  float local_5c;
  float local_58;
  float local_54;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)image->depth,&local_5d);
  iVar1 = image->depth;
  __return_storage_ptr__->depth = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->pixel = (uchar *)0x0;
  __return_storage_ptr__->row = (uchar **)0x0;
  __return_storage_ptr__->img = (uchar ***)0x0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (__return_storage_ptr__,w,h,(long)iVar1);
  if (0 < h) {
    local_58 = (float)image->width / (float)w;
    local_5c = (float)image->height / (float)h;
    lVar3 = 0;
    local_50 = h;
    do {
      if (0 < w) {
        local_54 = (float)lVar3 * local_5c;
        lVar4 = 0;
        do {
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                    (image,&local_48,(float)lVar4 * local_58,local_54);
          if (0 < image->depth) {
            lVar2 = 0;
            do {
              __return_storage_ptr__->img[lVar2][lVar3][lVar4] =
                   (uchar)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar2];
              lVar2 = lVar2 + 1;
            } while (lVar2 < image->depth);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != w);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != local_50);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> resizeImageBilinear(const Image<T> &image, long w, long h)
{
  std::vector<typename Image<T>::work_t> v(image.getDepth());
  Image<T> ret(w, h, image.getDepth());

  const float fx=static_cast<float>(image.getWidth())/w;
  const float fy=static_cast<float>(image.getHeight())/h;

  for (long k=0; k<h; k++)
  {
    for (long i=0; i<w; i++)
    {
      image.getBilinear(v, i*fx, k*fy);

      for (int d=0; d<image.getDepth(); d++)
      {
        ret.set(i, k, d, static_cast<typename Image<T>::store_t>(v[d]));
      }
    }
  }

  return ret;
}